

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

string * __thiscall
helics::ValueFederateManager::getTarget_abi_cxx11_(ValueFederateManager *this,Input *inp)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator fnd;
  shared_handle inpHandle;
  shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  *this_00;
  _Self local_50 [3];
  _Self local_38 [2];
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffffd8;
  string *local_8;
  
  this_00 = (shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
             *)(local_38 + 1);
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffffd8);
  gmlc::libguarded::
  shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::operator->(this_00);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00,(key_type *)0x2dfe42);
  gmlc::libguarded::
  shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::operator->((shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
                *)(local_38 + 1));
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_00);
  bVar1 = std::operator==(local_38,local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_8 = (string *)emptyStr_abi_cxx11_;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x2dfe8b);
    local_8 = &ppVar2->second;
  }
  gmlc::libguarded::
  shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
              *)0x2dfed6);
  return local_8;
}

Assistant:

const std::string& ValueFederateManager::getTarget(const Input& inp) const
{
    auto inpHandle = inputTargets.lock_shared();
    auto fnd = inpHandle->find(inp.handle);
    if (fnd != inpHandle->end()) {
        return fnd->second;
    }
    return emptyStr;
}